

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileCheckpointWriter::SingleFileCheckpointWriter
          (SingleFileCheckpointWriter *this,
          optional_ptr<duckdb::ClientContext,_true> client_context_p,AttachedDatabase *db,
          BlockManager *block_manager,CheckpointType checkpoint_type)

{
  (this->super_CheckpointWriter).db = db;
  (this->super_CheckpointWriter)._vptr_CheckpointWriter =
       (_func_int **)&PTR__SingleFileCheckpointWriter_027c3340;
  (this->client_context).ptr = client_context_p.ptr;
  (this->metadata_writer).
  super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t.
  super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>.
  super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl = (MetadataWriter *)0x0;
  (this->table_metadata_writer).
  super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t.
  super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>.
  super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl = (MetadataWriter *)0x0;
  PartialBlockManager::PartialBlockManager
            (&this->partial_block_manager,block_manager,FULL_CHECKPOINT,
             (optional_idx)0xffffffffffffffff,0x100000);
  this->checkpoint_type = checkpoint_type;
  (this->verify_block_usage_count)._M_h._M_buckets =
       &(this->verify_block_usage_count)._M_h._M_single_bucket;
  (this->verify_block_usage_count)._M_h._M_bucket_count = 1;
  (this->verify_block_usage_count)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->verify_block_usage_count)._M_h._M_element_count = 0;
  (this->verify_block_usage_count)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->verify_block_usage_count)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->verify_block_usage_count)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

SingleFileCheckpointWriter::SingleFileCheckpointWriter(optional_ptr<ClientContext> client_context_p,
                                                       AttachedDatabase &db, BlockManager &block_manager,
                                                       CheckpointType checkpoint_type)
    : CheckpointWriter(db), client_context(client_context_p),
      partial_block_manager(block_manager, PartialBlockType::FULL_CHECKPOINT), checkpoint_type(checkpoint_type) {
}